

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

OpCode __thiscall
ParamEntry::assumedExtension(ParamEntry *this,Address *addr,int4 sz,VarnodeData *res)

{
  int iVar1;
  uintb uVar2;
  int4 iVar3;
  uintb uVar4;
  uintb uVar5;
  int4 alignAdjust;
  VarnodeData *res_local;
  int4 sz_local;
  Address *addr_local;
  ParamEntry *this_local;
  
  if ((this->flags & 0x2c) == 0) {
    this_local._4_4_ = CPUI_COPY;
  }
  else {
    if (this->alignment == 0) {
      if (this->size <= sz) {
        return CPUI_COPY;
      }
    }
    else if (this->alignment <= sz) {
      return CPUI_COPY;
    }
    if (this->joinrec == (JoinRecord *)0x0) {
      iVar3 = justifiedContain(this,addr,sz);
      if (iVar3 == 0) {
        if (this->alignment == 0) {
          res->space = this->spaceid;
          res->offset = this->addressbase;
          res->size = this->size;
        }
        else {
          res->space = this->spaceid;
          uVar4 = Address::getOffset(addr);
          uVar2 = this->addressbase;
          iVar1 = this->alignment;
          uVar5 = Address::getOffset(addr);
          res->offset = uVar5 - (long)(int)((uVar4 - uVar2) % (ulong)(long)iVar1);
          res->size = this->alignment;
        }
        if ((this->flags & 4) == 0) {
          if ((this->flags & 0x20) == 0) {
            this_local._4_4_ = CPUI_INT_SEXT;
          }
          else {
            this_local._4_4_ = CPUI_PIECE;
          }
        }
        else {
          this_local._4_4_ = CPUI_INT_ZEXT;
        }
      }
      else {
        this_local._4_4_ = CPUI_COPY;
      }
    }
    else {
      this_local._4_4_ = CPUI_COPY;
    }
  }
  return this_local._4_4_;
}

Assistant:

OpCode ParamEntry::assumedExtension(const Address &addr,int4 sz,VarnodeData &res) const

{
  if ((flags & (smallsize_zext|smallsize_sext|smallsize_inttype))==0) return CPUI_COPY;
  if (alignment != 0) {
    if (sz >= alignment)
      return CPUI_COPY;
  }
  else if (sz >= size)
    return CPUI_COPY;
  if (joinrec != (JoinRecord *)0) return CPUI_COPY;
  if (justifiedContain(addr,sz)!=0) return CPUI_COPY; // (addr,sz) is not justified properly to allow an extension
  if (alignment == 0) {	// If exclusion, take up the whole entry
    res.space = spaceid;
    res.offset = addressbase;
    res.size = size;
  }
  else {	// Otherwise take up whole alignment
    res.space = spaceid;
    int4 alignAdjust = (addr.getOffset() - addressbase) % alignment;
    res.offset = addr.getOffset() - alignAdjust;
    res.size = alignment;
  }
  if ((flags & smallsize_zext)!=0)
    return CPUI_INT_ZEXT;
  if ((flags & smallsize_inttype)!=0)
    return CPUI_PIECE;
  return CPUI_INT_SEXT;
}